

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  uint uVar4;
  void **ppvVar5;
  int iVar6;
  uint uVar7;
  Aig_Obj_t *pObj_00;
  uint uVar8;
  
  uVar1 = *(ulong *)&pObj->field_0x18;
  uVar4 = (uint)uVar1;
  bVar3 = true;
  if ((uVar4 & 7) == 3) {
    bVar3 = (pObj->field_0).CioId < p->nTruePos;
  }
  if ((uVar1 & 0x20) != 0) {
    return;
  }
  if (!bVar3) {
    return;
  }
  if ((uVar1 & 0x10) != 0) goto LAB_00834c84;
  if ((uVar4 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                  ,0x405,
                  "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  *(ulong *)&pObj->field_0x18 = uVar1 | 0x20;
  if ((uVar4 & 7) - 7 < 0xfffffffe) goto LAB_00834c84;
  uVar4 = vCone->nCap;
  if (vCone->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vCone->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vCone->pArray,0x80);
      }
      vCone->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar4 * 2;
      if (iVar6 <= (int)uVar4) goto LAB_00834c72;
      if (vCone->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vCone->pArray,(ulong)uVar4 << 4);
      }
      vCone->pArray = ppvVar5;
    }
    vCone->nCap = iVar6;
  }
LAB_00834c72:
  iVar6 = vCone->nSize;
  vCone->nSize = iVar6 + 1;
  vCone->pArray[iVar6] = pObj;
LAB_00834c84:
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                  ,0x40a,
                  "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) != 0) {
    uVar8 = 0;
    uVar4 = 0xffffffff;
    do {
      if (uVar8 == 0) {
        if (p->nFansAlloc <= pObj->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar6 = pObj->Id * 5;
      }
      else {
        if (p->nFansAlloc <= (int)uVar4 / 2) {
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar6 = ((int)uVar4 >> 1) * 5 + (uVar4 & 1) + 3;
      }
      pVVar2 = p->vObjs;
      uVar4 = p->pFanData[iVar6];
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pObj_00 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar7 = (int)uVar4 >> 1;
        if (((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj_00 = (Aig_Obj_t *)pVVar2->pArray[uVar7];
      }
      Llb_ManFlowCollectAndMarkCone_rec(p,pObj_00,vCone);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(uint *)&pObj->field_0x18 >> 6);
  }
  return;
}

Assistant:

void Llb_ManFlowCollectAndMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Saig_ObjIsLi(p, pObj) )
        return;
    if ( pObj->fMarkB )
        return;
    if ( pObj->fMarkA == 0 )
    {
        assert( Aig_ObjIsNode(pObj) );
        pObj->fMarkB = 1;
        if ( Aig_ObjIsNode(pObj) )
            Vec_PtrPush( vCone, pObj );
    }
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Llb_ManFlowCollectAndMarkCone_rec( p, pFanout, vCone );
}